

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::isDouble(Value *this)

{
  char *in_RDI;
  Value *in_stack_000001c8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  string local_30 [47];
  byte local_1;
  
  if (in_RDI[8] == '\x04') {
    local_1 = 1;
  }
  else if (in_RDI[8] == '\x05') {
    asString_abi_cxx11_(in_stack_000001c8);
    std::__cxx11::string::c_str();
    local_1 = convertToDouble(in_RDI,(double *)
                                     CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    std::__cxx11::string::~string(local_30);
  }
  else {
    local_1 = isIntegral((Value *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Value::isDouble() const {
  switch (type_) {
  case realValue:
    return true;
  case stringValue:
    return convertToDouble(asString().c_str(), NULL);
  default:
    break;
  }

  return isIntegral();
}